

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zpivotgrowth.c
# Opt level: O0

double zPivotGrowth(int ncols,SuperMatrix *A,int *perm_c,SuperMatrix *L,SuperMatrix *U)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  void *addr;
  double dVar10;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_d8;
  double local_c8;
  long local_b0;
  doublecomplex *luval;
  double smlnum;
  double maxuj;
  double maxaj;
  double rpg;
  int *inv_perm_c;
  int_t oldcol;
  int_t k;
  int_t j;
  int_t i;
  int_t nz_in_U;
  int_t luptr;
  int nsupr;
  int fsupc;
  doublecomplex *Uval;
  doublecomplex *Lval;
  doublecomplex *Aval;
  NCformat *Ustore;
  SCformat *Lstore;
  NCformat *Astore;
  SuperMatrix *U_local;
  SuperMatrix *L_local;
  int *perm_c_local;
  SuperMatrix *A_local;
  int ncols_local;
  
  dVar10 = dmach("S");
  maxaj = 1.0 / dVar10;
  pvVar4 = A->Store;
  pvVar5 = L->Store;
  pvVar6 = U->Store;
  lVar7 = *(long *)((long)pvVar4 + 8);
  lVar8 = *(long *)((long)pvVar5 + 8);
  lVar9 = *(long *)((long)pvVar6 + 8);
  addr = superlu_malloc((long)A->ncol << 2);
  for (oldcol = 0; oldcol < A->ncol; oldcol = oldcol + 1) {
    *(int_t *)((long)addr + (long)perm_c[oldcol] * 4) = oldcol;
  }
  for (inv_perm_c._4_4_ = 0; inv_perm_c._4_4_ <= *(int *)((long)pvVar5 + 4);
      inv_perm_c._4_4_ = inv_perm_c._4_4_ + 1) {
    oldcol = *(int *)(*(long *)((long)pvVar5 + 0x30) + (long)inv_perm_c._4_4_ * 4);
    iVar1 = *(int *)(*(long *)((long)pvVar5 + 0x20) + (long)(oldcol + 1) * 4);
    iVar2 = *(int *)(*(long *)((long)pvVar5 + 0x20) + (long)oldcol * 4);
    local_b0 = lVar8 + (long)*(int *)(*(long *)((long)pvVar5 + 0x10) + (long)oldcol * 4) * 0x10;
    j = 1;
    for (; oldcol < *(int *)(*(long *)((long)pvVar5 + 0x30) + (long)(inv_perm_c._4_4_ + 1) * 4) &&
           oldcol < ncols; oldcol = oldcol + 1) {
      maxuj = 0.0;
      iVar3 = *(int *)((long)addr + (long)oldcol * 4);
      for (k = *(int_t *)(*(long *)((long)pvVar4 + 0x18) + (long)iVar3 * 4);
          k < *(int *)(*(long *)((long)pvVar4 + 0x18) + (long)(iVar3 + 1) * 4); k = k + 1) {
        dVar10 = z_abs1((doublecomplex *)(lVar7 + (long)k * 0x10));
        if (maxuj <= dVar10) {
          local_c8 = z_abs1((doublecomplex *)(lVar7 + (long)k * 0x10));
        }
        else {
          local_c8 = maxuj;
        }
        maxuj = local_c8;
      }
      smlnum = 0.0;
      for (k = *(int_t *)(*(long *)((long)pvVar6 + 0x18) + (long)oldcol * 4);
          k < *(int *)(*(long *)((long)pvVar6 + 0x18) + (long)(oldcol + 1) * 4); k = k + 1) {
        dVar10 = z_abs1((doublecomplex *)(lVar9 + (long)k * 0x10));
        if (smlnum <= dVar10) {
          local_d8 = z_abs1((doublecomplex *)(lVar9 + (long)k * 0x10));
        }
        else {
          local_d8 = smlnum;
        }
        smlnum = local_d8;
      }
      for (k = 0; k < j; k = k + 1) {
        dVar10 = z_abs1((doublecomplex *)(local_b0 + (long)k * 0x10));
        if (smlnum <= dVar10) {
          local_e8 = z_abs1((doublecomplex *)(local_b0 + (long)k * 0x10));
        }
        else {
          local_e8 = smlnum;
        }
        smlnum = local_e8;
      }
      j = j + 1;
      local_b0 = local_b0 + (long)(iVar1 - iVar2) * 0x10;
      if ((smlnum != 0.0) || (NAN(smlnum))) {
        if (maxuj / smlnum <= maxaj) {
          local_f8 = maxuj / smlnum;
        }
        else {
          local_f8 = maxaj;
        }
        maxaj = local_f8;
      }
      else {
        if (1.0 <= maxaj) {
          local_f0 = 1.0;
        }
        else {
          local_f0 = maxaj;
        }
        maxaj = local_f0;
      }
    }
    if (ncols <= oldcol) break;
  }
  superlu_free(addr);
  return maxaj;
}

Assistant:

double
zPivotGrowth(int ncols, SuperMatrix *A, int *perm_c, 
             SuperMatrix *L, SuperMatrix *U)
{

    NCformat *Astore;
    SCformat *Lstore;
    NCformat *Ustore;
    doublecomplex  *Aval, *Lval, *Uval;
    int      fsupc, nsupr;
    int_t    luptr, nz_in_U;
    int_t    i, j, k, oldcol;
    int      *inv_perm_c;
    double   rpg, maxaj, maxuj;
    double   smlnum;
    doublecomplex   *luval;
   
    /* Get machine constants. */
    smlnum = dmach("S");
    rpg = 1. / smlnum;

    Astore = A->Store;
    Lstore = L->Store;
    Ustore = U->Store;
    Aval = Astore->nzval;
    Lval = Lstore->nzval;
    Uval = Ustore->nzval;
    
    inv_perm_c = (int *) SUPERLU_MALLOC(A->ncol*sizeof(int));
    for (j = 0; j < A->ncol; ++j) inv_perm_c[perm_c[j]] = j;

    for (k = 0; k <= Lstore->nsuper; ++k) {
	fsupc = L_FST_SUPC(k);
	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	luptr = L_NZ_START(fsupc);
	luval = &Lval[luptr];
	nz_in_U = 1;
	
	for (j = fsupc; j < L_FST_SUPC(k+1) && j < ncols; ++j) {
	    maxaj = 0.;
            oldcol = inv_perm_c[j];
	    for (i = Astore->colptr[oldcol]; i < Astore->colptr[oldcol+1]; ++i)
		maxaj = SUPERLU_MAX( maxaj, z_abs1( &Aval[i]) );
	
	    maxuj = 0.;
	    for (i = Ustore->colptr[j]; i < Ustore->colptr[j+1]; i++)
		maxuj = SUPERLU_MAX( maxuj, z_abs1( &Uval[i]) );
	    
	    /* Supernode */
	    for (i = 0; i < nz_in_U; ++i)
		maxuj = SUPERLU_MAX( maxuj, z_abs1( &luval[i]) );

	    ++nz_in_U;
	    luval += nsupr;

	    if ( maxuj == 0. )
		rpg = SUPERLU_MIN( rpg, 1.);
	    else
		rpg = SUPERLU_MIN( rpg, maxaj / maxuj );
	}
	
	if ( j >= ncols ) break;
    }

    SUPERLU_FREE(inv_perm_c);
    return (rpg);
}